

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void __thiscall
basisu::vector<basisu::tree_vector_quant<basisu::vec<16U,_float>_>::tsvq_node>::clear
          (vector<basisu::tree_vector_quant<basisu::vec<16U,_float>_>::tsvq_node> *this)

{
  tsvq_node *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  if (*(long *)in_RDI != 0) {
    scalar_type<basisu::tree_vector_quant<basisu::vec<16U,_float>_>::tsvq_node>::destruct_array
              (in_RDI,in_stack_ffffffffffffffe8);
    free(*(void **)in_RDI);
    *(undefined8 *)in_RDI = 0;
    *(undefined4 *)&in_RDI->m_weight = 0;
    *(undefined4 *)((long)&in_RDI->m_weight + 4) = 0;
  }
  return;
}

Assistant:

inline void clear()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
            m_p = NULL;
            m_size = 0;
            m_capacity = 0;
         }
      }